

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Test<short,4,false,3u,true>
          (StorageAndSubImageTest *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  PrepareFramebuffer(this,0x8d88,3);
  bVar1 = CreateTexture<short,4,false,3u,true>(this);
  if (bVar1) {
    Draw(this);
    bVar1 = Check<short,4,false,3u>(this);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x480))(1,&this->m_to);
      this->m_to = 0;
    }
    CleanFramebuffer(this);
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    do {
      iVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    } while (iVar3 != 0);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool StorageAndSubImageTest::Test()
{
	/* Setup. */
	PrepareFramebuffer(InternalFormat<T, S, N>(), D);

	if (!CreateTexture<T, S, N, D, I>())
	{
		return false;
	}

	/* Action. */
	Draw();

	/* Compare results with reference. */
	bool result = Check<T, S, N, D>();

	/* Cleanup. */
	CleanTexture();
	CleanFramebuffer();
	CleanErrors();

	/* Pass result. */
	return result;
}